

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_path_rendering(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_path_rendering != 0) {
    glad_glGenPathsNV = (PFNGLGENPATHSNVPROC)(*load)("glGenPathsNV");
    glad_glDeletePathsNV = (PFNGLDELETEPATHSNVPROC)(*load)("glDeletePathsNV");
    glad_glIsPathNV = (PFNGLISPATHNVPROC)(*load)("glIsPathNV");
    glad_glPathCommandsNV = (PFNGLPATHCOMMANDSNVPROC)(*load)("glPathCommandsNV");
    glad_glPathCoordsNV = (PFNGLPATHCOORDSNVPROC)(*load)("glPathCoordsNV");
    glad_glPathSubCommandsNV = (PFNGLPATHSUBCOMMANDSNVPROC)(*load)("glPathSubCommandsNV");
    glad_glPathSubCoordsNV = (PFNGLPATHSUBCOORDSNVPROC)(*load)("glPathSubCoordsNV");
    glad_glPathStringNV = (PFNGLPATHSTRINGNVPROC)(*load)("glPathStringNV");
    glad_glPathGlyphsNV = (PFNGLPATHGLYPHSNVPROC)(*load)("glPathGlyphsNV");
    glad_glPathGlyphRangeNV = (PFNGLPATHGLYPHRANGENVPROC)(*load)("glPathGlyphRangeNV");
    glad_glWeightPathsNV = (PFNGLWEIGHTPATHSNVPROC)(*load)("glWeightPathsNV");
    glad_glCopyPathNV = (PFNGLCOPYPATHNVPROC)(*load)("glCopyPathNV");
    glad_glInterpolatePathsNV = (PFNGLINTERPOLATEPATHSNVPROC)(*load)("glInterpolatePathsNV");
    glad_glTransformPathNV = (PFNGLTRANSFORMPATHNVPROC)(*load)("glTransformPathNV");
    glad_glPathParameterivNV = (PFNGLPATHPARAMETERIVNVPROC)(*load)("glPathParameterivNV");
    glad_glPathParameteriNV = (PFNGLPATHPARAMETERINVPROC)(*load)("glPathParameteriNV");
    glad_glPathParameterfvNV = (PFNGLPATHPARAMETERFVNVPROC)(*load)("glPathParameterfvNV");
    glad_glPathParameterfNV = (PFNGLPATHPARAMETERFNVPROC)(*load)("glPathParameterfNV");
    glad_glPathDashArrayNV = (PFNGLPATHDASHARRAYNVPROC)(*load)("glPathDashArrayNV");
    glad_glPathStencilFuncNV = (PFNGLPATHSTENCILFUNCNVPROC)(*load)("glPathStencilFuncNV");
    glad_glPathStencilDepthOffsetNV =
         (PFNGLPATHSTENCILDEPTHOFFSETNVPROC)(*load)("glPathStencilDepthOffsetNV");
    glad_glStencilFillPathNV = (PFNGLSTENCILFILLPATHNVPROC)(*load)("glStencilFillPathNV");
    glad_glStencilStrokePathNV = (PFNGLSTENCILSTROKEPATHNVPROC)(*load)("glStencilStrokePathNV");
    glad_glStencilFillPathInstancedNV =
         (PFNGLSTENCILFILLPATHINSTANCEDNVPROC)(*load)("glStencilFillPathInstancedNV");
    glad_glStencilStrokePathInstancedNV =
         (PFNGLSTENCILSTROKEPATHINSTANCEDNVPROC)(*load)("glStencilStrokePathInstancedNV");
    glad_glPathCoverDepthFuncNV = (PFNGLPATHCOVERDEPTHFUNCNVPROC)(*load)("glPathCoverDepthFuncNV");
    glad_glCoverFillPathNV = (PFNGLCOVERFILLPATHNVPROC)(*load)("glCoverFillPathNV");
    glad_glCoverStrokePathNV = (PFNGLCOVERSTROKEPATHNVPROC)(*load)("glCoverStrokePathNV");
    glad_glCoverFillPathInstancedNV =
         (PFNGLCOVERFILLPATHINSTANCEDNVPROC)(*load)("glCoverFillPathInstancedNV");
    glad_glCoverStrokePathInstancedNV =
         (PFNGLCOVERSTROKEPATHINSTANCEDNVPROC)(*load)("glCoverStrokePathInstancedNV");
    glad_glGetPathParameterivNV = (PFNGLGETPATHPARAMETERIVNVPROC)(*load)("glGetPathParameterivNV");
    glad_glGetPathParameterfvNV = (PFNGLGETPATHPARAMETERFVNVPROC)(*load)("glGetPathParameterfvNV");
    glad_glGetPathCommandsNV = (PFNGLGETPATHCOMMANDSNVPROC)(*load)("glGetPathCommandsNV");
    glad_glGetPathCoordsNV = (PFNGLGETPATHCOORDSNVPROC)(*load)("glGetPathCoordsNV");
    glad_glGetPathDashArrayNV = (PFNGLGETPATHDASHARRAYNVPROC)(*load)("glGetPathDashArrayNV");
    glad_glGetPathMetricsNV = (PFNGLGETPATHMETRICSNVPROC)(*load)("glGetPathMetricsNV");
    glad_glGetPathMetricRangeNV = (PFNGLGETPATHMETRICRANGENVPROC)(*load)("glGetPathMetricRangeNV");
    glad_glGetPathSpacingNV = (PFNGLGETPATHSPACINGNVPROC)(*load)("glGetPathSpacingNV");
    glad_glIsPointInFillPathNV = (PFNGLISPOINTINFILLPATHNVPROC)(*load)("glIsPointInFillPathNV");
    glad_glIsPointInStrokePathNV =
         (PFNGLISPOINTINSTROKEPATHNVPROC)(*load)("glIsPointInStrokePathNV");
    glad_glGetPathLengthNV = (PFNGLGETPATHLENGTHNVPROC)(*load)("glGetPathLengthNV");
    glad_glPointAlongPathNV = (PFNGLPOINTALONGPATHNVPROC)(*load)("glPointAlongPathNV");
    glad_glMatrixLoad3x2fNV = (PFNGLMATRIXLOAD3X2FNVPROC)(*load)("glMatrixLoad3x2fNV");
    glad_glMatrixLoad3x3fNV = (PFNGLMATRIXLOAD3X3FNVPROC)(*load)("glMatrixLoad3x3fNV");
    glad_glMatrixLoadTranspose3x3fNV =
         (PFNGLMATRIXLOADTRANSPOSE3X3FNVPROC)(*load)("glMatrixLoadTranspose3x3fNV");
    glad_glMatrixMult3x2fNV = (PFNGLMATRIXMULT3X2FNVPROC)(*load)("glMatrixMult3x2fNV");
    glad_glMatrixMult3x3fNV = (PFNGLMATRIXMULT3X3FNVPROC)(*load)("glMatrixMult3x3fNV");
    glad_glMatrixMultTranspose3x3fNV =
         (PFNGLMATRIXMULTTRANSPOSE3X3FNVPROC)(*load)("glMatrixMultTranspose3x3fNV");
    glad_glStencilThenCoverFillPathNV =
         (PFNGLSTENCILTHENCOVERFILLPATHNVPROC)(*load)("glStencilThenCoverFillPathNV");
    glad_glStencilThenCoverStrokePathNV =
         (PFNGLSTENCILTHENCOVERSTROKEPATHNVPROC)(*load)("glStencilThenCoverStrokePathNV");
    glad_glStencilThenCoverFillPathInstancedNV =
         (PFNGLSTENCILTHENCOVERFILLPATHINSTANCEDNVPROC)
         (*load)("glStencilThenCoverFillPathInstancedNV");
    glad_glStencilThenCoverStrokePathInstancedNV =
         (PFNGLSTENCILTHENCOVERSTROKEPATHINSTANCEDNVPROC)
         (*load)("glStencilThenCoverStrokePathInstancedNV");
    glad_glPathGlyphIndexRangeNV =
         (PFNGLPATHGLYPHINDEXRANGENVPROC)(*load)("glPathGlyphIndexRangeNV");
    glad_glPathGlyphIndexArrayNV =
         (PFNGLPATHGLYPHINDEXARRAYNVPROC)(*load)("glPathGlyphIndexArrayNV");
    glad_glPathMemoryGlyphIndexArrayNV =
         (PFNGLPATHMEMORYGLYPHINDEXARRAYNVPROC)(*load)("glPathMemoryGlyphIndexArrayNV");
    glad_glProgramPathFragmentInputGenNV =
         (PFNGLPROGRAMPATHFRAGMENTINPUTGENNVPROC)(*load)("glProgramPathFragmentInputGenNV");
    glad_glGetProgramResourcefvNV =
         (PFNGLGETPROGRAMRESOURCEFVNVPROC)(*load)("glGetProgramResourcefvNV");
    glad_glPathColorGenNV = (PFNGLPATHCOLORGENNVPROC)(*load)("glPathColorGenNV");
    glad_glPathTexGenNV = (PFNGLPATHTEXGENNVPROC)(*load)("glPathTexGenNV");
    glad_glPathFogGenNV = (PFNGLPATHFOGGENNVPROC)(*load)("glPathFogGenNV");
    glad_glGetPathColorGenivNV = (PFNGLGETPATHCOLORGENIVNVPROC)(*load)("glGetPathColorGenivNV");
    glad_glGetPathColorGenfvNV = (PFNGLGETPATHCOLORGENFVNVPROC)(*load)("glGetPathColorGenfvNV");
    glad_glGetPathTexGenivNV = (PFNGLGETPATHTEXGENIVNVPROC)(*load)("glGetPathTexGenivNV");
    glad_glGetPathTexGenfvNV = (PFNGLGETPATHTEXGENFVNVPROC)(*load)("glGetPathTexGenfvNV");
  }
  return;
}

Assistant:

static void load_GL_NV_path_rendering(GLADloadproc load) {
	if(!GLAD_GL_NV_path_rendering) return;
	glad_glGenPathsNV = (PFNGLGENPATHSNVPROC)load("glGenPathsNV");
	glad_glDeletePathsNV = (PFNGLDELETEPATHSNVPROC)load("glDeletePathsNV");
	glad_glIsPathNV = (PFNGLISPATHNVPROC)load("glIsPathNV");
	glad_glPathCommandsNV = (PFNGLPATHCOMMANDSNVPROC)load("glPathCommandsNV");
	glad_glPathCoordsNV = (PFNGLPATHCOORDSNVPROC)load("glPathCoordsNV");
	glad_glPathSubCommandsNV = (PFNGLPATHSUBCOMMANDSNVPROC)load("glPathSubCommandsNV");
	glad_glPathSubCoordsNV = (PFNGLPATHSUBCOORDSNVPROC)load("glPathSubCoordsNV");
	glad_glPathStringNV = (PFNGLPATHSTRINGNVPROC)load("glPathStringNV");
	glad_glPathGlyphsNV = (PFNGLPATHGLYPHSNVPROC)load("glPathGlyphsNV");
	glad_glPathGlyphRangeNV = (PFNGLPATHGLYPHRANGENVPROC)load("glPathGlyphRangeNV");
	glad_glWeightPathsNV = (PFNGLWEIGHTPATHSNVPROC)load("glWeightPathsNV");
	glad_glCopyPathNV = (PFNGLCOPYPATHNVPROC)load("glCopyPathNV");
	glad_glInterpolatePathsNV = (PFNGLINTERPOLATEPATHSNVPROC)load("glInterpolatePathsNV");
	glad_glTransformPathNV = (PFNGLTRANSFORMPATHNVPROC)load("glTransformPathNV");
	glad_glPathParameterivNV = (PFNGLPATHPARAMETERIVNVPROC)load("glPathParameterivNV");
	glad_glPathParameteriNV = (PFNGLPATHPARAMETERINVPROC)load("glPathParameteriNV");
	glad_glPathParameterfvNV = (PFNGLPATHPARAMETERFVNVPROC)load("glPathParameterfvNV");
	glad_glPathParameterfNV = (PFNGLPATHPARAMETERFNVPROC)load("glPathParameterfNV");
	glad_glPathDashArrayNV = (PFNGLPATHDASHARRAYNVPROC)load("glPathDashArrayNV");
	glad_glPathStencilFuncNV = (PFNGLPATHSTENCILFUNCNVPROC)load("glPathStencilFuncNV");
	glad_glPathStencilDepthOffsetNV = (PFNGLPATHSTENCILDEPTHOFFSETNVPROC)load("glPathStencilDepthOffsetNV");
	glad_glStencilFillPathNV = (PFNGLSTENCILFILLPATHNVPROC)load("glStencilFillPathNV");
	glad_glStencilStrokePathNV = (PFNGLSTENCILSTROKEPATHNVPROC)load("glStencilStrokePathNV");
	glad_glStencilFillPathInstancedNV = (PFNGLSTENCILFILLPATHINSTANCEDNVPROC)load("glStencilFillPathInstancedNV");
	glad_glStencilStrokePathInstancedNV = (PFNGLSTENCILSTROKEPATHINSTANCEDNVPROC)load("glStencilStrokePathInstancedNV");
	glad_glPathCoverDepthFuncNV = (PFNGLPATHCOVERDEPTHFUNCNVPROC)load("glPathCoverDepthFuncNV");
	glad_glCoverFillPathNV = (PFNGLCOVERFILLPATHNVPROC)load("glCoverFillPathNV");
	glad_glCoverStrokePathNV = (PFNGLCOVERSTROKEPATHNVPROC)load("glCoverStrokePathNV");
	glad_glCoverFillPathInstancedNV = (PFNGLCOVERFILLPATHINSTANCEDNVPROC)load("glCoverFillPathInstancedNV");
	glad_glCoverStrokePathInstancedNV = (PFNGLCOVERSTROKEPATHINSTANCEDNVPROC)load("glCoverStrokePathInstancedNV");
	glad_glGetPathParameterivNV = (PFNGLGETPATHPARAMETERIVNVPROC)load("glGetPathParameterivNV");
	glad_glGetPathParameterfvNV = (PFNGLGETPATHPARAMETERFVNVPROC)load("glGetPathParameterfvNV");
	glad_glGetPathCommandsNV = (PFNGLGETPATHCOMMANDSNVPROC)load("glGetPathCommandsNV");
	glad_glGetPathCoordsNV = (PFNGLGETPATHCOORDSNVPROC)load("glGetPathCoordsNV");
	glad_glGetPathDashArrayNV = (PFNGLGETPATHDASHARRAYNVPROC)load("glGetPathDashArrayNV");
	glad_glGetPathMetricsNV = (PFNGLGETPATHMETRICSNVPROC)load("glGetPathMetricsNV");
	glad_glGetPathMetricRangeNV = (PFNGLGETPATHMETRICRANGENVPROC)load("glGetPathMetricRangeNV");
	glad_glGetPathSpacingNV = (PFNGLGETPATHSPACINGNVPROC)load("glGetPathSpacingNV");
	glad_glIsPointInFillPathNV = (PFNGLISPOINTINFILLPATHNVPROC)load("glIsPointInFillPathNV");
	glad_glIsPointInStrokePathNV = (PFNGLISPOINTINSTROKEPATHNVPROC)load("glIsPointInStrokePathNV");
	glad_glGetPathLengthNV = (PFNGLGETPATHLENGTHNVPROC)load("glGetPathLengthNV");
	glad_glPointAlongPathNV = (PFNGLPOINTALONGPATHNVPROC)load("glPointAlongPathNV");
	glad_glMatrixLoad3x2fNV = (PFNGLMATRIXLOAD3X2FNVPROC)load("glMatrixLoad3x2fNV");
	glad_glMatrixLoad3x3fNV = (PFNGLMATRIXLOAD3X3FNVPROC)load("glMatrixLoad3x3fNV");
	glad_glMatrixLoadTranspose3x3fNV = (PFNGLMATRIXLOADTRANSPOSE3X3FNVPROC)load("glMatrixLoadTranspose3x3fNV");
	glad_glMatrixMult3x2fNV = (PFNGLMATRIXMULT3X2FNVPROC)load("glMatrixMult3x2fNV");
	glad_glMatrixMult3x3fNV = (PFNGLMATRIXMULT3X3FNVPROC)load("glMatrixMult3x3fNV");
	glad_glMatrixMultTranspose3x3fNV = (PFNGLMATRIXMULTTRANSPOSE3X3FNVPROC)load("glMatrixMultTranspose3x3fNV");
	glad_glStencilThenCoverFillPathNV = (PFNGLSTENCILTHENCOVERFILLPATHNVPROC)load("glStencilThenCoverFillPathNV");
	glad_glStencilThenCoverStrokePathNV = (PFNGLSTENCILTHENCOVERSTROKEPATHNVPROC)load("glStencilThenCoverStrokePathNV");
	glad_glStencilThenCoverFillPathInstancedNV = (PFNGLSTENCILTHENCOVERFILLPATHINSTANCEDNVPROC)load("glStencilThenCoverFillPathInstancedNV");
	glad_glStencilThenCoverStrokePathInstancedNV = (PFNGLSTENCILTHENCOVERSTROKEPATHINSTANCEDNVPROC)load("glStencilThenCoverStrokePathInstancedNV");
	glad_glPathGlyphIndexRangeNV = (PFNGLPATHGLYPHINDEXRANGENVPROC)load("glPathGlyphIndexRangeNV");
	glad_glPathGlyphIndexArrayNV = (PFNGLPATHGLYPHINDEXARRAYNVPROC)load("glPathGlyphIndexArrayNV");
	glad_glPathMemoryGlyphIndexArrayNV = (PFNGLPATHMEMORYGLYPHINDEXARRAYNVPROC)load("glPathMemoryGlyphIndexArrayNV");
	glad_glProgramPathFragmentInputGenNV = (PFNGLPROGRAMPATHFRAGMENTINPUTGENNVPROC)load("glProgramPathFragmentInputGenNV");
	glad_glGetProgramResourcefvNV = (PFNGLGETPROGRAMRESOURCEFVNVPROC)load("glGetProgramResourcefvNV");
	glad_glPathColorGenNV = (PFNGLPATHCOLORGENNVPROC)load("glPathColorGenNV");
	glad_glPathTexGenNV = (PFNGLPATHTEXGENNVPROC)load("glPathTexGenNV");
	glad_glPathFogGenNV = (PFNGLPATHFOGGENNVPROC)load("glPathFogGenNV");
	glad_glGetPathColorGenivNV = (PFNGLGETPATHCOLORGENIVNVPROC)load("glGetPathColorGenivNV");
	glad_glGetPathColorGenfvNV = (PFNGLGETPATHCOLORGENFVNVPROC)load("glGetPathColorGenfvNV");
	glad_glGetPathTexGenivNV = (PFNGLGETPATHTEXGENIVNVPROC)load("glGetPathTexGenivNV");
	glad_glGetPathTexGenfvNV = (PFNGLGETPATHTEXGENFVNVPROC)load("glGetPathTexGenfvNV");
}